

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

MultiplyLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_multiply(NeuralNetworkLayer *this)

{
  bool bVar1;
  MultiplyLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_multiply(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_multiply(this);
    this_00 = (MultiplyLayerParams *)operator_new(0x18);
    MultiplyLayerParams::MultiplyLayerParams(this_00);
    (this->layer_).multiply_ = this_00;
  }
  return (MultiplyLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::MultiplyLayerParams* NeuralNetworkLayer::mutable_multiply() {
  if (!has_multiply()) {
    clear_layer();
    set_has_multiply();
    layer_.multiply_ = new ::CoreML::Specification::MultiplyLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.multiply)
  return layer_.multiply_;
}